

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

pair<std::complex<double>,_std::complex<double>_> *
Utils::SolveQuadratic
          (pair<std::complex<double>,_std::complex<double>_> *__return_storage_ptr__,double a,
          double b,double c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  dVar1 = csqrt(b * b + a * -4.0 * c);
  dVar3 = a + a;
  *(double *)(__return_storage_ptr__->first)._M_value = (dVar1 - b) / dVar3;
  *(double *)((__return_storage_ptr__->first)._M_value + 8) = (dVar2 + 0.0) / dVar3;
  *(double *)(__return_storage_ptr__->second)._M_value = (-b - dVar1) / dVar3;
  *(double *)((__return_storage_ptr__->second)._M_value + 8) = (0.0 - dVar2) / dVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Complex, Complex> Utils::SolveQuadratic(double a, double b, double c)
{
    Complex D = std::sqrt(Complex(b * b - 4 * a * c));
    return {(Complex(-b) + D) / (2 * a), (Complex(-b) - D) / (2 * a)};
}